

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dt-from-pseudo-root-dt.cpp
# Opt level: O3

Up __thiscall
yactfr::internal::DtFromPseudoRootDtConverter::
_dtFromPseudoVarType<yactfr::VariantWithUnsignedIntegerSelectorType,std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>>
          (DtFromPseudoRootDtConverter *this,PseudoVarType *pseudoVarType,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
          *selTypeMappings,DataLocation *selLoc)

{
  long lVar1;
  long lVar2;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> _Var3;
  bool bVar4;
  mapped_type *pmVar5;
  const_iterator cVar6;
  ostream *poVar7;
  _Rb_tree_header *p_Var8;
  DtFromPseudoRootDtConverter *pDVar9;
  DataLocation *in_R8;
  uint uVar10;
  mapped_type mVar11;
  Options opts;
  ostringstream ss;
  undefined1 local_208 [16];
  undefined1 local_1f8 [32];
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  local_1d8;
  _Head_base<0UL,_const_yactfr::DataType_*,_false> local_1c0;
  _Base_ptr local_1b8;
  _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_1b0;
  VariantWithUnsignedIntegerSelectorType local_1a8 [2];
  
  local_208._8_8_ = selLoc;
  local_1c0._M_head_impl = (DataType *)this;
  bVar4 = _intTypeMappingsOverlap<std::map<std::__cxx11::string,yactfr::IntegerRangeSet<unsigned_long_long,true>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,yactfr::IntegerRangeSet<unsigned_long_long,true>>>>>
                    ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
                      *)selLoc);
  if (bVar4) {
    local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
    super_CompoundDataType.super_DataType._vptr_DataType =
         (_func_int **)
         &local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
          super_CompoundDataType.super_DataType._attrs;
    pDVar9 = (DtFromPseudoRootDtConverter *)local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)pDVar9,"Selector type of variant type contains overlapping mappings.","");
    p_Var8 = &(selTypeMappings->_M_t)._M_impl.super__Rb_tree_header;
    _throwInvalDataLoc(pDVar9,(string *)local_1a8,(TextLocation *)p_Var8,in_R8,
                       (TextLocation *)p_Var8);
  }
  local_1d8.
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.
  super__Vector_base<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (selTypeMappings[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
      *(_Base_ptr *)&selTypeMappings[1]._M_t._M_impl.super__Rb_tree_header._M_header) {
    local_1b0 = (_Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)&(pseudoVarType->super_PseudoDt)._posInScope.super_type.m_storage;
    local_1b8 = (_Base_ptr)(local_208._8_8_ + 8);
    uVar10 = 1;
    mVar11 = 0;
    do {
      local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
      super_CompoundDataType.super_DataType._vptr_DataType = (_func_int **)selTypeMappings;
      pmVar5 = std::__detail::
               _Map_base<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[](local_1b0,(key_type *)local_1a8);
      *pmVar5 = mVar11;
      lVar1 = *(long *)&selTypeMappings[1]._M_t._M_impl.super__Rb_tree_header._M_header;
      lVar2 = *(long *)(lVar1 + mVar11 * 8);
      if (*(char *)(lVar2 + 8) == '\0') {
        __assert_fail("pseudoOpt->name()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/eepp[P]yactfr/yactfr/internal/metadata/dt-from-pseudo-root-dt.cpp"
                      ,0x17d,
                      "DataType::Up yactfr::internal::DtFromPseudoRootDtConverter::_dtFromPseudoVarType(const PseudoVarType &, const MappingsT &, const DataLocation &) [VarTypeT = yactfr::VariantWithUnsignedIntegerSelectorType, MappingsT = std::map<std::basic_string<char>, yactfr::IntegerRangeSet<unsigned long long>>]"
                     );
      }
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::IntegerRangeSet<unsigned_long_long,_true>_>_>_>
                      *)local_208._8_8_,(key_type *)(lVar2 + 0x10));
      if (cVar6._M_node == local_1b8) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Selector type of variant type has no mapping named `",0x34)
        ;
        lVar1 = *(long *)(lVar1 + mVar11 * 8);
        if (*(char *)(lVar1 + 8) != '\0') {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,*(char **)(lVar1 + 0x10),*(long *)(lVar1 + 0x18))
          ;
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"`.",2);
          pDVar9 = (DtFromPseudoRootDtConverter *)local_1f8;
          std::__cxx11::stringbuf::str();
          p_Var8 = &(selTypeMappings->_M_t)._M_impl.super__Rb_tree_header;
          _throwInvalDataLoc(pDVar9,(string *)local_1f8,(TextLocation *)p_Var8,in_R8,
                             (TextLocation *)p_Var8);
        }
LAB_001fa30c:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4bb,
                      "reference_const_type boost::optional<std::basic_string<char>>::get() const [T = std::basic_string<char>]"
                     );
      }
      lVar1 = *(long *)(lVar1 + mVar11 * 8);
      if (*(char *)(lVar1 + 8) == '\0') goto LAB_001fa30c;
      _dtFromPseudoDt((DtFromPseudoRootDtConverter *)local_1f8,&pseudoVarType->super_PseudoDt);
      _tryCloneAttrs((MapItem *)local_208);
      std::
      make_unique<yactfr::VariantTypeOption<unsigned_long_long>const,std::__cxx11::string_const&,std::unique_ptr<yactfr::DataType_const,std::default_delete<yactfr::DataType_const>>,yactfr::IntegerRangeSet<unsigned_long_long,true>const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                 (unique_ptr<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>_> *
                 )(lVar1 + 0x10),(IntegerRangeSet<unsigned_long_long,_true> *)local_1f8,
                 (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                 (cVar6._M_node + 2));
      std::
      vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
      ::
      emplace_back<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>
                ((vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>
                  *)&local_1d8,
                 (unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>
                  *)local_1a8);
      if ((VariantTypeOption<unsigned_long_long> *)
          local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
          super_CompoundDataType.super_DataType._vptr_DataType !=
          (VariantTypeOption<unsigned_long_long> *)0x0) {
        std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>::operator()
                  ((default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_> *)local_1a8
                   ,(VariantTypeOption<unsigned_long_long> *)
                    local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.
                    super_VariantType.super_CompoundDataType.super_DataType._vptr_DataType);
      }
      local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
      super_CompoundDataType.super_DataType._vptr_DataType = (_func_int **)0x0;
      std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::
      ~unique_ptr((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
                  local_208);
      if ((StructureType *)local_1f8._0_8_ != (StructureType *)0x0) {
        (**(code **)(*(long *)local_1f8._0_8_ + 8))();
      }
      mVar11 = (mapped_type)uVar10;
      uVar10 = uVar10 + 1;
    } while (mVar11 < (ulong)((long)selTypeMappings[1]._M_t._M_impl.super__Rb_tree_header._M_header.
                                    _M_parent -
                              *(long *)&selTypeMappings[1]._M_t._M_impl.super__Rb_tree_header.
                                        _M_header >> 3));
  }
  local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
  super_CompoundDataType.super_DataType._vptr_DataType = (_func_int **)selTypeMappings;
  std::
  _Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_erase((_Hashtable<const_yactfr::internal::PseudoDt_*,_std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>,_std::allocator<std::pair<const_yactfr::internal::PseudoDt_*const,_unsigned_long_long>_>,_std::__detail::_Select1st,_std::equal_to<const_yactfr::internal::PseudoDt_*>,_std::hash<const_yactfr::internal::PseudoDt_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              *)&(pseudoVarType->super_PseudoDt)._posInScope.super_type.m_storage);
  local_208._0_4_ = 1;
  _tryCloneAttrs((MapItem *)local_1f8);
  VariantWithUnsignedIntegerSelectorType::
  create<int,std::vector<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>,std::allocator<std::unique_ptr<yactfr::VariantTypeOption<unsigned_long_long>const,std::default_delete<yactfr::VariantTypeOption<unsigned_long_long>const>>>>,yactfr::DataLocation_const&,std::unique_ptr<yactfr::MapItem_const,std::default_delete<yactfr::MapItem_const>>>
            (local_1a8,(int *)local_208,&local_1d8,in_R8,
             (unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_1f8);
  _Var3._M_head_impl = local_1c0._M_head_impl;
  (local_1c0._M_head_impl)->_vptr_DataType =
       local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
       super_CompoundDataType.super_DataType._vptr_DataType;
  local_1a8[0].super_VariantWithIntegerSelectorType<unsigned_long_long>.super_VariantType.
  super_CompoundDataType.super_DataType._vptr_DataType = (_func_int **)0x0;
  std::unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_>::~unique_ptr
            ((unique_ptr<const_yactfr::MapItem,_std::default_delete<const_yactfr::MapItem>_> *)
             local_1f8);
  std::
  vector<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>,_std::allocator<std::unique_ptr<const_yactfr::VariantTypeOption<unsigned_long_long>,_std::default_delete<const_yactfr::VariantTypeOption<unsigned_long_long>_>_>_>_>
  ::~vector(&local_1d8);
  return (__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
          )(__uniq_ptr_data<const_yactfr::DataType,_std::default_delete<const_yactfr::DataType>,_true,_true>
            )_Var3._M_head_impl;
}

Assistant:

DataType::Up DtFromPseudoRootDtConverter::_dtFromPseudoVarType(const PseudoVarType& pseudoVarType,
                                                               const MappingsT& selTypeMappings,
                                                               const DataLocation& selLoc)
{
    // validate that the selector type has no overlapping mappings
    if (this->_intTypeMappingsOverlap(selTypeMappings)) {
        this->_throwInvalDataLoc("Selector type of variant type contains overlapping mappings.",
                                 pseudoVarType.loc(), selLoc, pseudoVarType.loc());
    }

    typename VarTypeT::Options opts;

    for (auto i = 0U; i < pseudoVarType.pseudoOpts().size(); ++i) {
        // currently being visited
        _current[&pseudoVarType] = i;

        const auto& pseudoOpt = pseudoVarType.pseudoOpts()[i];

        assert(pseudoOpt->name());

        const auto rangesIt = selTypeMappings.find(*pseudoOpt->name());

        // validate that the range set exists
        if (rangesIt == selTypeMappings.end()) {
            std::ostringstream ss;

            ss << "Selector type of variant type has no mapping named `" <<
                  *pseudoOpt->name() << "`.";
            this->_throwInvalDataLoc(ss.str(), pseudoVarType.loc(), selLoc, pseudoVarType.loc());
        }

        opts.push_back(VarTypeT::Option::create(*pseudoOpt->name(),
                                                this->_dtFromPseudoDt(pseudoOpt->pseudoDt()),
                                                rangesIt->second,
                                                this->_tryCloneAttrs(pseudoOpt->attrs())));
    }

    // not visited anymore
    _current.erase(&pseudoVarType);

    return VarTypeT::create(1, std::move(opts), selLoc,
                            this->_tryCloneAttrs(pseudoVarType.attrs()));
}